

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  int iVar1;
  _func_int **pp_Var2;
  ArrayDisposer **ppAVar3;
  String *ctx;
  undefined8 uVar4;
  WriteMode mode_00;
  undefined4 in_register_0000000c;
  long lVar5;
  Directory *pDVar6;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  void *__child_stack;
  _func_int **pp_Var7;
  Directory *extraout_RDX_01;
  Directory *extraout_RDX_02;
  undefined1 uVar8;
  void *__arg;
  ulong in_R8;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar9;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Array<kj::String> local_68;
  undefined1 local_50 [32];
  
  lVar5 = CONCAT44(in_register_0000000c,mode);
  pDVar6 = (Directory *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  __arg = (void *)(in_R8 & 0xffffffff);
  uVar8 = SUB81(__arg,0);
  if (lVar5 == 1) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)(local_50 + 0x10)
               ,name_00.content.ptr + 1);
    pp_Var2 = pDVar6[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var7 = (_func_int **)0x3fdd82;
    }
    else {
      pp_Var7 = (pDVar6->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    mode_00 = (int)pp_Var2 + (uint)(pp_Var2 == (_func_int **)0x0);
    name.content.size_ = (size_t)pp_Var7;
    name.content.ptr = (char *)local_50._24_8_;
    Impl::openEntry((Impl *)&local_68,name,mode_00);
    ctx = local_68.ptr;
    if ((EVP_PKEY_CTX *)local_68.ptr == (EVP_PKEY_CTX *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      iVar1 = *(int *)((long)local_68.ptr + 0x18);
      if (iVar1 == 0) {
        local_50[0] = (bool)(uVar8 & _S_black);
        if ((in_R8 & 1) == 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)&local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x6c8,FAILED,"has(mode, WriteMode::CREATE)","_kjCondition,",
                     (DebugExpression<bool> *)local_50);
          kj::_::Debug::Fault::fatal((Fault *)&local_68);
        }
        uVar4 = (**(code **)**(undefined8 **)local_50._24_8_)();
        *(undefined8 *)(local_50._24_8_ + 0x40) = uVar4;
        Impl::newDirectory((Impl *)local_50);
        EntryImpl::init((EntryImpl *)&local_68,(EVP_PKEY_CTX *)ctx);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)local_68.ptr;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_68.size_;
        local_68.size_ = 0;
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&local_68);
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)local_50);
      }
      else if (iVar1 == 3) {
        SymlinkNode::parse((Path *)&local_68,(SymlinkNode *)((long)local_68.ptr + 0x20));
        Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                  ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)(local_50 + 0x10));
        path_00.parts.size_ = (size_t)local_68.ptr;
        path_00.parts.ptr = name_00.content.ptr;
        tryOpenSubdir(this,path_00,(WriteMode)local_68.size_);
        Array<kj::String>::~Array(&local_68);
      }
      else if (iVar1 == 2) {
        Directory::clone((Directory *)&local_68,*(__fn **)((long)local_68.ptr + 0x28),__child_stack,
                         mode_00,__arg);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)local_68.ptr;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_68.size_;
        local_68.size_ = 0;
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&local_68);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
                  ((Fault *)&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x6cc,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x40e2be);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)&local_68);
      }
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)(local_50 + 0x10));
    pDVar6 = extraout_RDX_02;
  }
  else if (lVar5 == 0) {
    if ((in_R8 & 2) == 0) {
      if ((in_R8 & 1) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                  ((Fault *)&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x49f,FAILED,(char *)0x0,"\"can\'t replace self\"",
                   (char (*) [19])"can\'t replace self");
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)&local_68);
        pDVar6 = extraout_RDX;
      }
      else {
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      }
    }
    else {
      LOCK();
      ppAVar3 = &((name_00.content.ptr)->content).disposer;
      *(int *)ppAVar3 = *(int *)ppAVar3 + 1;
      UNLOCK();
      local_68.ptr = (String *)&((name_00.content.ptr)->content).size_;
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)local_68.ptr;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
           (_func_int **)name_00.content.ptr;
      local_68.size_ = 0;
      Own<const_kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t>::~Own
                ((Own<const_kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t> *)
                 &local_68);
      pDVar6 = extraout_RDX_00;
    }
  }
  else {
    pp_Var2 = pDVar6[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var7 = (_func_int **)0x3fdd82;
    }
    else {
      pp_Var7 = (pDVar6->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var7;
    tryGetParent((InMemoryDirectory *)local_50,name_00,
                 (int)pp_Var2 + (uint)(pp_Var2 == (_func_int **)0x0));
    uVar4 = local_50._8_8_;
    local_68.size_ = local_50._8_8_;
    local_50._8_8_ = (_Base_ptr)0x0;
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)local_50);
    if ((_Base_ptr)uVar4 == (_Base_ptr)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)uVar4 + 0x88))(this,uVar4,pDVar6 + 3,lVar5 + -1,__arg);
    }
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)&local_68);
    pDVar6 = extraout_RDX_01;
  }
  MVar9.ptr.ptr = pDVar6;
  MVar9.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar9.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        return atomicAddRef(*this);
      } else if (has(mode, WriteMode::CREATE)) {
        return kj::none;  // already exists
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return kj::none; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        return asDirectory(lock, entry, mode);
      } else {
        return kj::none;
      }
    }